

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  bool result;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  char *in_stack_fffffffffffffa78;
  LogStringBuffer *in_stack_fffffffffffffa80;
  LogStringBuffer *in_stack_fffffffffffffab8;
  OutputWorker *in_stack_fffffffffffffac0;
  Channel *pCVar3;
  byte local_51d [5];
  char *local_518;
  Channel *local_510;
  byte *local_508;
  char *local_500;
  Channel *local_4f8;
  char *local_4f0;
  undefined4 local_4e4;
  Channel *local_4e0;
  undefined4 local_4d4;
  Channel *local_4d0;
  undefined1 local_4b8 [16];
  ostream aoStack_4a8 [376];
  char *local_330;
  undefined4 local_324;
  Channel *local_320;
  char *local_318;
  string *local_310;
  undefined1 *local_308;
  OutputWorker *local_300;
  string *local_2f8;
  undefined1 *local_2f0;
  OutputWorker *local_2e8;
  string *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  OutputWorker *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  byte *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  Channel *local_290;
  undefined4 local_284;
  Channel *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  byte *local_e0;
  char *local_d8;
  undefined4 local_cc;
  Channel *local_c8;
  byte *local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  Channel *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  Channel *local_88;
  undefined8 local_80;
  undefined1 *local_78;
  byte *local_70;
  char *local_68;
  undefined1 *local_60;
  Channel *local_58;
  char *local_50;
  undefined1 *local_48;
  Channel *local_40;
  byte *local_38;
  undefined1 *local_30;
  Channel *local_28;
  char *local_20;
  undefined1 *local_18;
  byte *local_10;
  undefined1 *local_8;
  
  local_51d[1] = 0;
  local_51d[2] = 0;
  local_51d[3] = 0;
  local_51d[4] = 0;
  local_510 = &Logger;
  local_518 = "Basic API test running for 2 seconds";
  local_4e0 = &Logger;
  local_4e4 = 2;
  local_4f0 = "Basic API test running for 2 seconds";
  local_4d0 = &Logger;
  local_4d4 = 2;
  if ((int)Logger.ChannelMinLevel < 3) {
    local_320 = &Logger;
    local_324 = 2;
    local_330 = "Basic API test running for 2 seconds";
    pCVar3 = &Logger;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,Trace);
    local_310 = (string *)
                ((((OutputWorker *)pCVar3)->QueueLock).super___mutex_base._M_mutex.__size + 0x10);
    local_318 = local_330;
    in_stack_fffffffffffffac0 = (OutputWorker *)pCVar3;
    local_308 = local_4b8;
    local_300 = (OutputWorker *)pCVar3;
    local_2f8 = local_310;
    local_2f0 = local_4b8;
    local_2e8 = (OutputWorker *)pCVar3;
    local_2e0 = local_310;
    local_2d8 = local_4b8;
    std::operator<<(aoStack_4a8,local_310);
    local_2c8 = local_308;
    local_2d0 = local_318;
    local_2b0 = local_308;
    local_2b8 = local_318;
    local_2c0 = (OutputWorker *)pCVar3;
    std::operator<<((ostream *)(local_308 + 0x10),local_318);
    in_stack_fffffffffffffab8 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x106742);
  }
  local_51d[0] = TestAPI();
  local_4f8 = &Logger;
  local_500 = "Test returned result = ";
  local_508 = local_51d;
  local_290 = &Logger;
  local_294 = 2;
  local_2a0 = "Test returned result = ";
  local_280 = &Logger;
  local_284 = 2;
  if ((int)Logger.ChannelMinLevel < 3) {
    local_c8 = &Logger;
    local_cc = 2;
    local_d8 = "Test returned result = ";
    local_2a8 = local_508;
    local_e0 = local_508;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,Trace);
    local_b0 = 0x13e4a8;
    local_a0 = &Logger;
    local_b8 = local_d8;
    local_c0 = local_e0;
    local_88 = &Logger;
    local_a8 = local_268;
    local_98 = local_b0;
    local_90 = local_268;
    local_80 = local_b0;
    local_78 = local_268;
    std::operator<<(aoStack_258,(string *)&Logger.Prefix);
    local_58 = &Logger;
    local_60 = local_a8;
    local_68 = local_b8;
    local_70 = local_c0;
    local_40 = &Logger;
    local_48 = local_a8;
    local_50 = local_b8;
    local_18 = local_a8;
    local_20 = local_b8;
    std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
    local_28 = &Logger;
    local_30 = local_60;
    local_38 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    pcVar2 = "false";
    if ((*local_70 & 1) != 0) {
      pcVar2 = "true";
    }
    std::operator<<((ostream *)(local_60 + 0x10),pcVar2);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x106aa0);
  }
  iVar1 = -1;
  if ((local_51d[0] & 1) != 0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main()
{
    Logger.Info("Basic API test running for 2 seconds");

    const bool result = TestAPI();

    Logger.Info("Test returned result = ", result);

    return result ? 0 : -1;
}